

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O1

void __thiscall booster::streambuf::~streambuf(streambuf *this)

{
  io_device *piVar1;
  _data *p_Var2;
  pointer pcVar3;
  
  *(undefined ***)this = &PTR__streambuf_001d0518;
  piVar1 = (this->device_unique_ptr_)._M_t.
           super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
           super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
           super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl;
  if (piVar1 != (io_device *)0x0) {
    (*piVar1->_vptr_io_device[4])();
  }
  (this->device_unique_ptr_)._M_t.
  super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
  super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
  super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl = (io_device *)0x0;
  p_Var2 = (this->d).ptr_;
  if (p_Var2 != (_data *)0x0) {
    operator_delete(p_Var2);
  }
  pcVar3 = (this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->buffer_out_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3);
  }
  *(code **)this = __cxa_guard_release;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

streambuf::~streambuf()
	{
	}